

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_7_except_63_Test::~FastPForTest_fastpack_7_except_63_Test
          (FastPForTest_fastpack_7_except_63_Test *this)

{
  FastPForTest_fastpack_7_except_63_Test *in_stack_00000010;
  
  ~FastPForTest_fastpack_7_except_63_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_7_except_63) {
    _genDataWithFixBits64(in64, 7, 256);
    std::vector<int64_t> excepts;
    _genDataWithFixBits64(excepts, 63, 6);
    in64[0] = excepts[0];
    in64[10] = excepts[1];
    in64[100] = excepts[2];
    in64[133] = excepts[3];
    in64[177] = excepts[4];
    in64[213] = excepts[5];
    _verify64();
  }